

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManRefSelect_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  int iVar2;
  uint uVar3;
  Rfn_Obj_t *pRVar4;
  Gia_Obj_t *pGVar5;
  Rfn_Obj_t *pRVar6;
  Rfn_Obj_t *pRVar7;
  Rfn_Obj_t *pRef1;
  Rfn_Obj_t *pRef0;
  Rfn_Obj_t *pRef;
  int i;
  int Sign_local;
  Vec_Int_t *vSelect_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Gla_Man_t *p_local;
  
  pRVar4 = Gla_ObjRef(p,pObj,f);
  if (((uint)*pRVar4 >> 1 & 1) == 0) {
    if (p->pPars->fPropFanout == 0) {
      *pRVar4 = (Rfn_Obj_t)((uint)*pRVar4 & 0xfffffffd | 2);
    }
    else {
      Gia_ManRefSetAndPropFanout_rec(p,pObj,f,vSelect,Sign);
    }
    if (((uint)*pRVar4 >> 2 & 1) == 0) {
      iVar2 = Gia_ObjIsPi(p->pGia,pObj);
      if ((iVar2 == 0) && (iVar2 = Gia_ObjIsConst0(pObj), iVar2 == 0)) {
        iVar2 = Gia_ObjIsRo(p->pGia,pObj);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsAnd(pObj);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x1a5,
                          "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                         );
          }
          pGVar5 = Gia_ObjFanin0(pObj);
          pRVar6 = Gla_ObjRef(p,pGVar5,f);
          pGVar5 = Gia_ObjFanin1(pObj);
          pRVar7 = Gla_ObjRef(p,pGVar5,f);
          if (((uint)*pRVar4 & 1) == 1) {
            if (((uint)*pRVar6 >> 3 & 0xffff) != 0) {
              pGVar5 = Gia_ObjFanin0(pObj);
              Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
            }
            if (((uint)*pRVar7 >> 3 & 0xffff) != 0) {
              pGVar5 = Gia_ObjFanin1(pObj);
              Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
            }
          }
          else {
            RVar1 = *pRVar6;
            uVar3 = Gia_ObjFaninC0(pObj);
            if ((((uint)RVar1 & 1) == uVar3) &&
               (RVar1 = *pRVar7, uVar3 = Gia_ObjFaninC1(pObj), ((uint)RVar1 & 1) == uVar3)) {
              if (((uint)*pRVar7 >> 3 & 0xffff) < ((uint)*pRVar6 >> 3 & 0xffff)) {
                if (((uint)*pRVar7 >> 3 & 0xffff) != 0) {
                  pGVar5 = Gia_ObjFanin1(pObj);
                  Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
                }
              }
              else if (((uint)*pRVar6 >> 3 & 0xffff) != 0) {
                pGVar5 = Gia_ObjFanin0(pObj);
                Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
              }
            }
            else {
              RVar1 = *pRVar6;
              uVar3 = Gia_ObjFaninC0(pObj);
              if (((uint)RVar1 & 1) == uVar3) {
                if (((uint)*pRVar6 >> 3 & 0xffff) != 0) {
                  pGVar5 = Gia_ObjFanin0(pObj);
                  Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
                }
              }
              else {
                RVar1 = *pRVar7;
                uVar3 = Gia_ObjFaninC1(pObj);
                if (((uint)RVar1 & 1) != uVar3) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                                ,0x1a2,
                                "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                               );
                }
                if (((uint)*pRVar7 >> 3 & 0xffff) != 0) {
                  pGVar5 = Gia_ObjFanin1(pObj);
                  Gla_ManRefSelect_rec(p,pGVar5,f,vSelect,Sign);
                }
              }
            }
          }
        }
        else if (0 < f) {
          pGVar5 = Gia_ObjRoToRi(p->pGia,pObj);
          pGVar5 = Gia_ObjFanin0(pGVar5);
          Gla_ManRefSelect_rec(p,pGVar5,f + -1,vSelect,Sign);
        }
      }
    }
    else {
      if (((uint)*pRVar4 >> 3 & 0xffff) == 0) {
        __assert_fail("(int)pRef->Prio > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x168,
                      "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)");
      }
      if (p->pPars->fPropFanout == 0) {
        iVar2 = Gia_ObjId(p->pGia,pObj);
        Vec_IntPush(vSelect,iVar2);
        Vec_IntAddToEntry(p->vObjCounts,f,1);
      }
      else {
        for (pRef._0_4_ = p->pPars->iFrame; -1 < (int)pRef; pRef._0_4_ = (int)pRef + -1) {
          pRVar4 = Gla_ObjRef(p,pObj,(int)pRef);
          if (((uint)*pRVar4 >> 1 & 1) == 0) {
            Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)pRef,vSelect,Sign);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Gla_ManRefSelect_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{ 
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef = Gla_ObjRef( p, pObj, f );
//    assert( (int)pRef->Sign == Sign );
    if ( pRef->fVisit )
        return;
    if ( p->pPars->fPropFanout )
        Gia_ManRefSetAndPropFanout_rec( p, pObj, f, vSelect, Sign );
    else
        pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        if ( p->pPars->fPropFanout )
        {
            for ( i = p->pPars->iFrame; i >= 0; i-- )
                if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                    Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
            Vec_IntAddToEntry( p->vObjCounts, f, 1 );
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect, Sign );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rfn_Obj_t * pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
        Rfn_Obj_t * pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
        if ( pRef->Value == 1 )
        {
            if ( pRef0->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            if ( pRef1->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
        }
        else // select one value
        {
            if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef0->Prio <= pRef1->Prio ) // choice
                {
                    if ( pRef0->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
                }
                else
                {
                    if ( pRef1->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
                }
            }
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRef0->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            }
            else if ( (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef1->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}